

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int write_mtree_entry(archive_write *a,mtree_entry_conflict *me)

{
  mtree_writer *mtree_00;
  uint uVar1;
  int iVar2;
  mtree_entry_conflict *in_RSI;
  long in_RDI;
  int ret;
  int keys;
  archive_string *str;
  mtree_writer *mtree;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  mode_t mVar3;
  archive_string *in_stack_ffffffffffffffd0;
  archive_write *a_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  archive_write *s;
  
  mtree_00 = *(mtree_writer **)(in_RDI + 0xd0);
  if (in_RSI->dir_info != (dir_info *)0x0) {
    if (mtree_00->classic != 0) {
      if (mtree_00->dironly == 0) {
        archive_strappend_char
                  (in_stack_ffffffffffffffd0,(char)((uint)in_stack_ffffffffffffffcc >> 0x18));
      }
      if ((in_RSI->parentdir).s == (char *)0x0) {
        archive_string_sprintf(&mtree_00->buf,"# %s\n",(in_RSI->basename).s);
      }
      else {
        archive_string_sprintf
                  (&mtree_00->buf,"# %s/%s\n",(in_RSI->parentdir).s,(in_RSI->basename).s);
      }
    }
    if (mtree_00->output_global_set != 0) {
      write_global(_ret);
    }
  }
  (mtree_00->ebuf).length = 0;
  if ((mtree_00->indent == 0) && (mtree_00->classic == 0)) {
    a_00 = (archive_write *)&mtree_00->buf;
  }
  else {
    a_00 = (archive_write *)&mtree_00->ebuf;
  }
  s = a_00;
  if ((mtree_00->classic == 0) && ((in_RSI->parentdir).s != (char *)0x0)) {
    mtree_quote((archive_string *)a_00,
                (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    archive_strappend_char((archive_string *)a_00,(char)((uint)in_stack_ffffffffffffffcc >> 0x18));
  }
  mtree_quote((archive_string *)s,
              (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar1 = get_global_set_keys(mtree_00,in_RSI);
  if ((((uVar1 & 0x400) != 0) && (in_RSI->nlink != 1)) && (in_RSI->filetype != 0x4000)) {
    archive_string_sprintf((archive_string *)s," nlink=%u",(ulong)in_RSI->nlink);
  }
  if (((uVar1 & 0x20) != 0) && ((in_RSI->gname).length != 0)) {
    archive_strcat((archive_string *)a_00,
                   (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    mtree_quote((archive_string *)s,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  }
  if (((uVar1 & 0x200000) != 0) && ((in_RSI->uname).length != 0)) {
    archive_strcat((archive_string *)a_00,
                   (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    mtree_quote((archive_string *)s,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  }
  if ((uVar1 & 8) != 0) {
    if ((in_RSI->fflags_text).length == 0) {
      if (((mtree_00->set).processing != 0) && (((mtree_00->set).keys & 8U) != 0)) {
        archive_strcat((archive_string *)a_00,
                       (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
    }
    else {
      archive_strcat((archive_string *)a_00,
                     (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      mtree_quote((archive_string *)s,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
    }
  }
  if ((uVar1 & 0x40000) != 0) {
    archive_string_sprintf((archive_string *)s," time=%jd.%jd",in_RSI->mtime,in_RSI->mtime_nsec);
  }
  if ((uVar1 & 0x200) != 0) {
    archive_string_sprintf((archive_string *)s," mode=%o",(ulong)in_RSI->mode);
  }
  if ((uVar1 & 0x10) != 0) {
    archive_string_sprintf((archive_string *)s," gid=%jd",in_RSI->gid);
  }
  if ((uVar1 & 0x100000) != 0) {
    archive_string_sprintf((archive_string *)s," uid=%jd",in_RSI->uid);
  }
  if ((uVar1 & 0x4000000) != 0) {
    archive_string_sprintf((archive_string *)s," inode=%jd",in_RSI->ino);
  }
  if ((uVar1 & 0x8000000) != 0) {
    archive_string_sprintf
              ((archive_string *)s," resdevice=native,%ju,%ju",in_RSI->devmajor,in_RSI->devminor);
  }
  mVar3 = in_RSI->filetype;
  if (mVar3 == 0x1000) {
    if ((uVar1 & 0x80000) != 0) {
      archive_strcat((archive_string *)a_00,(void *)CONCAT44(0x1000,in_stack_ffffffffffffffc8));
    }
  }
  else if (mVar3 == 0x2000) {
    if ((uVar1 & 0x80000) != 0) {
      archive_strcat((archive_string *)a_00,(void *)CONCAT44(0x2000,in_stack_ffffffffffffffc8));
    }
    if ((uVar1 & 2) != 0) {
      archive_string_sprintf
                ((archive_string *)s," device=native,%ju,%ju",in_RSI->rdevmajor,in_RSI->rdevminor);
    }
  }
  else if (mVar3 == 0x4000) {
    if ((uVar1 & 0x80000) != 0) {
      archive_strcat((archive_string *)a_00,(void *)CONCAT44(0x4000,in_stack_ffffffffffffffc8));
    }
  }
  else if (mVar3 == 0x6000) {
    if ((uVar1 & 0x80000) != 0) {
      archive_strcat((archive_string *)a_00,(void *)CONCAT44(0x6000,in_stack_ffffffffffffffc8));
    }
    if ((uVar1 & 2) != 0) {
      archive_string_sprintf
                ((archive_string *)s," device=native,%ju,%ju",in_RSI->rdevmajor,in_RSI->rdevminor);
    }
  }
  else {
    if (mVar3 != 0x8000) {
      if (mVar3 == 0xa000) {
        if ((uVar1 & 0x80000) != 0) {
          archive_strcat((archive_string *)a_00,(void *)CONCAT44(0xa000,in_stack_ffffffffffffffc8));
        }
        if ((uVar1 & 0x10000) != 0) {
          archive_strcat((archive_string *)a_00,(void *)CONCAT44(mVar3,in_stack_ffffffffffffffc8));
          mtree_quote((archive_string *)s,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
        }
        goto LAB_0019fcb4;
      }
      if (mVar3 == 0xc000) {
        if ((uVar1 & 0x80000) != 0) {
          archive_strcat((archive_string *)a_00,(void *)CONCAT44(0xc000,in_stack_ffffffffffffffc8));
        }
        goto LAB_0019fcb4;
      }
    }
    if ((uVar1 & 0x80000) != 0) {
      archive_strcat((archive_string *)a_00,(void *)CONCAT44(mVar3,in_stack_ffffffffffffffc8));
    }
    if ((uVar1 & 0x8000) != 0) {
      archive_string_sprintf((archive_string *)s," size=%jd",in_RSI->size);
    }
  }
LAB_0019fcb4:
  if (in_RSI->reg_info != (reg_info *)0x0) {
    sum_write((archive_string *)a_00,(reg_info *)CONCAT44(mVar3,in_stack_ffffffffffffffc8));
  }
  archive_strappend_char((archive_string *)a_00,(char)(mVar3 >> 0x18));
  if ((mtree_00->indent != 0) || (mtree_00->classic != 0)) {
    mtree_indent((mtree_writer *)in_RSI);
  }
  if ((mtree_00->buf).length < 0x8001) {
    iVar2 = 0;
  }
  else {
    iVar2 = __archive_write_output(a_00,(void *)CONCAT44(mVar3,in_stack_ffffffffffffffc8),0x19fd33);
    (mtree_00->buf).length = 0;
  }
  return iVar2;
}

Assistant:

static int
write_mtree_entry(struct archive_write *a, struct mtree_entry *me)
{
	struct mtree_writer *mtree = a->format_data;
	struct archive_string *str;
	int keys, ret;

	if (me->dir_info) {
		if (mtree->classic) {
			/*
			 * Output a comment line to describe the full
			 * pathname of the entry as mtree utility does
			 * while generating classic format.
			 */
			if (!mtree->dironly)
				archive_strappend_char(&mtree->buf, '\n');
			if (me->parentdir.s)
				archive_string_sprintf(&mtree->buf,
				    "# %s/%s\n",
				    me->parentdir.s, me->basename.s);
			else
				archive_string_sprintf(&mtree->buf,
				    "# %s\n",
				    me->basename.s);
		}
		if (mtree->output_global_set)
			write_global(mtree);
	}
	archive_string_empty(&mtree->ebuf);
	str = (mtree->indent || mtree->classic)? &mtree->ebuf : &mtree->buf;

	if (!mtree->classic && me->parentdir.s) {
		/*
		 * If generating format is not classic one(v1), output
		 * a full pathname.
		 */
		mtree_quote(str, me->parentdir.s);
		archive_strappend_char(str, '/');
	}
	mtree_quote(str, me->basename.s);

	keys = get_global_set_keys(mtree, me);
	if ((keys & F_NLINK) != 0 &&
	    me->nlink != 1 && me->filetype != AE_IFDIR)
		archive_string_sprintf(str, " nlink=%u", me->nlink);

	if ((keys & F_GNAME) != 0 && archive_strlen(&me->gname) > 0) {
		archive_strcat(str, " gname=");
		mtree_quote(str, me->gname.s);
	}
	if ((keys & F_UNAME) != 0 && archive_strlen(&me->uname) > 0) {
		archive_strcat(str, " uname=");
		mtree_quote(str, me->uname.s);
	}
	if ((keys & F_FLAGS) != 0) {
		if (archive_strlen(&me->fflags_text) > 0) {
			archive_strcat(str, " flags=");
			mtree_quote(str, me->fflags_text.s);
		} else if (mtree->set.processing &&
		    (mtree->set.keys & F_FLAGS) != 0)
			/* Overwrite the global parameter. */
			archive_strcat(str, " flags=none");
	}
	if ((keys & F_TIME) != 0)
		archive_string_sprintf(str, " time=%jd.%jd",
		    (intmax_t)me->mtime, (intmax_t)me->mtime_nsec);
	if ((keys & F_MODE) != 0)
		archive_string_sprintf(str, " mode=%o", (unsigned int)me->mode);
	if ((keys & F_GID) != 0)
		archive_string_sprintf(str, " gid=%jd", (intmax_t)me->gid);
	if ((keys & F_UID) != 0)
		archive_string_sprintf(str, " uid=%jd", (intmax_t)me->uid);

	if ((keys & F_INO) != 0)
		archive_string_sprintf(str, " inode=%jd", (intmax_t)me->ino);
	if ((keys & F_RESDEV) != 0) {
		archive_string_sprintf(str,
		    " resdevice=native,%ju,%ju",
		    (uintmax_t)me->devmajor,
		    (uintmax_t)me->devminor);
	}

	switch (me->filetype) {
	case AE_IFLNK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=link");
		if ((keys & F_SLINK) != 0) {
			archive_strcat(str, " link=");
			mtree_quote(str, me->symlink.s);
		}
		break;
	case AE_IFSOCK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=socket");
		break;
	case AE_IFCHR:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=char");
		if ((keys & F_DEV) != 0) {
			archive_string_sprintf(str,
			    " device=native,%ju,%ju",
			    (uintmax_t)me->rdevmajor,
			    (uintmax_t)me->rdevminor);
		}
		break;
	case AE_IFBLK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=block");
		if ((keys & F_DEV) != 0) {
			archive_string_sprintf(str,
			    " device=native,%ju,%ju",
			    (uintmax_t)me->rdevmajor,
			    (uintmax_t)me->rdevminor);
		}
		break;
	case AE_IFDIR:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=dir");
		break;
	case AE_IFIFO:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=fifo");
		break;
	case AE_IFREG:
	default:	/* Handle unknown file types as regular files. */
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=file");
		if ((keys & F_SIZE) != 0)
			archive_string_sprintf(str, " size=%jd",
			    (intmax_t)me->size);
		break;
	}

	/* Write a bunch of sum. */
	if (me->reg_info)
		sum_write(str, me->reg_info);

	archive_strappend_char(str, '\n');
	if (mtree->indent || mtree->classic)
		mtree_indent(mtree);

	if (mtree->buf.length > 32768) {
		ret = __archive_write_output(
			a, mtree->buf.s, mtree->buf.length);
		archive_string_empty(&mtree->buf);
	} else
		ret = ARCHIVE_OK;
	return (ret);
}